

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void parse_command(int argc,char **argv)

{
  bool bVar1;
  iterator iVar2;
  int iVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  param;
  string local_70;
  string local_50;
  
  if (argc != 1) {
    std::__cxx11::string::assign((char *)&args);
    for (iVar3 = 2; iVar3 < argc; iVar3 = iVar3 + 1) {
      if (*argv[iVar3] == '-') {
        param.first._M_dataplus._M_p = (pointer)&param.first.field_2;
        param.first._M_string_length = 0;
        param.first.field_2._M_local_buf[0] = '\0';
        param.second._M_dataplus._M_p = (pointer)&param.second.field_2;
        param.second._M_string_length = 0;
        param.second.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::assign((char *)&param);
        iVar2 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&hasargoption_abi_cxx11_._M_t,&param.first);
        if (((_Rb_tree_header *)iVar2._M_node !=
             &hasargoption_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) && (iVar3 + 1 < argc)) {
          std::__cxx11::string::assign((char *)&param.second);
          iVar3 = iVar3 + 1;
        }
        std::
        vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>&>
                  ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                    *)&args.options,&param);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(&param);
      }
      else {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char*&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &args.packages,argv + iVar3);
      }
    }
    bVar1 = std::operator==(&args.command,"help");
    if (((bVar1) || (bVar1 = std::operator==(&args.command,"-h"), bVar1)) ||
       (bVar1 = std::operator==(&args.command,"--help"), bVar1)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"",(allocator<char> *)&param);
      help_main(&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    bVar1 = std::operator==(&args.command,"-V");
    if ((bVar1) || (bVar1 = std::operator==(&args.command,"--version"), bVar1)) {
      print_version();
    }
    bVar1 = std::operator==(&args.command,"install");
    if (bVar1) {
      parse_install();
    }
    bVar1 = std::operator==(&args.command,"download");
    if (bVar1) {
      parse_download();
    }
    bVar1 = std::operator==(&args.command,"uninstall");
    if (bVar1) {
      parse_uninstall();
    }
    bVar1 = std::operator==(&args.command,"freeze");
    if (bVar1) {
      parse_freeze();
    }
    bVar1 = std::operator==(&args.command,"archive");
    if (bVar1) {
      parse_archive();
    }
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"",(allocator<char> *)&param);
  help_main(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void parse_command(int argc,char** argv) noexcept(false){
    if(argc==1){
        help_main();
        return;
    }
    args.command=argv[1];
    for(int i=2;i<argc;i++){
        if(argv[i][0]=='-') {
            std::pair<std::string,std::string> param;
            param.first=argv[i];
            if(hasargoption.find(param.first)!=hasargoption.end() && i+1<argc){
                param.second=argv[i+1];
                i++;
            }
            args.options.emplace_back(param);
        }else
            args.packages.emplace_back(argv[i]);
    }
    if(args.command=="help" || args.command=="-h" || args.command=="--help")
        help_main();
    if(args.command=="-V" || args.command=="--version")
        print_version();
    if(args.command=="install")
        parse_install();
    if(args.command=="download")
        parse_download();
    if(args.command=="uninstall")
        parse_uninstall();
    if(args.command=="freeze")
        parse_freeze();
    if(args.command=="archive")
        parse_archive();
}